

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O3

string * __thiscall json::array::dump_abi_cxx11_(string *__return_storage_ptr__,array *this)

{
  pointer ppvVar1;
  char cVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar2);
  ppvVar1 = (this->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar1 !=
      (this->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (ppvVar1 !=
          (this->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::push_back(cVar2);
      }
      (*(*ppvVar1)->_vptr_value[3])(local_50);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      ppvVar1 = ppvVar1 + 1;
    } while (ppvVar1 !=
             (this->_data).super__Vector_base<json::value_*,_std::allocator<json::value_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::push_back(cVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string json::array::dump () const
{
  std::string output;
  output += '[';

  for (auto i = _data.begin (); i != _data.end (); ++i)
  {
    if (i != _data.begin ())
      output += ',';

    output += (*i)->dump ();
  }

  output += ']';
  return output;
}